

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

void __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::stepToNext
          (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this)

{
  bool bVar1;
  reference pvVar2;
  HeapType local_18;
  HeapType item;
  TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this_local;
  
  item.id = (uintptr_t)this;
  do {
    bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(&this->workStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::back(&this->workStack);
    local_18.id = pvVar2->id;
    SubTypes::getSubTypesFirstSort()::HeapType_(this,local_18);
    pvVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::back(&this->workStack);
    bVar1 = HeapType::operator==(pvVar2,&local_18);
  } while (!bVar1);
  return;
}

Assistant:

void stepToNext() {
    while (!workStack.empty()) {
      T item = workStack.back();
      static_cast<Subtype*>(this)->pushPredecessors(item);
      if (workStack.back() == item) {
        // No unfinished predecessors, so this is the next item in the sort.
        break;
      }
    }
  }